

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_cluster(args_t *this,char *str)

{
  int iVar1;
  
  iVar1 = strcmp(str,"all");
  if (iVar1 == 0) {
    this->cluster_type = all;
  }
  else {
    iVar1 = strcmp(str,"any");
    if (iVar1 != 0) {
      ERROR("invalid cluster construction mode type: %s",str);
      return;
    }
    this->cluster_type = any;
  }
  return;
}

Assistant:

void args_t::parse_cluster( const char * str ) {
        if (!strcmp (str, "all")) {
            cluster_type = all;
        } else if (!strcmp (str, "any")) {
            cluster_type = any;
        } else  {
            ERROR( "invalid cluster construction mode type: %s", str );
        }
    }